

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 *pUVar2;
  seqDef *psVar3;
  bool bVar4;
  char cVar5;
  undefined8 uVar6;
  U32 lowestValid;
  uint uVar7;
  ulong *iLimit;
  BYTE *pBVar8;
  ulong *puVar9;
  byte bVar10;
  uint uVar11;
  ulong *puVar12;
  ulong *puVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  BYTE *litEnd;
  BYTE *pBVar28;
  uint uVar29;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  BYTE *local_b0;
  uint local_a4;
  ZSTD_matchState_t *local_a0;
  ulong *local_98;
  uint local_8c;
  ulong *local_88;
  BYTE *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_80 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  local_40 = local_80 + uVar15;
  local_b8 = (ms->cParams).minMatch;
  if (5 < local_b8) {
    local_b8 = 6;
  }
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  local_8c = (ms->cParams).searchLog;
  local_bc = 6;
  if (local_8c < 6) {
    local_bc = local_8c;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  puVar18 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar25 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar20 = (int)puVar18 - (int)local_80;
  local_58 = *rep;
  local_54 = iVar20 - uVar25;
  if (iVar20 - uVar15 <= uVar25) {
    local_54 = uVar15;
  }
  uVar25 = 0;
  if (ms->loadedDictEnd != 0) {
    local_54 = uVar15;
  }
  local_5c = rep[1];
  local_54 = iVar20 - local_54;
  uVar15 = local_5c;
  if (local_54 < local_5c) {
    uVar15 = uVar25;
  }
  local_b4 = local_58;
  if (local_54 < local_58) {
    local_b4 = uVar25;
  }
  ms->lazySkipping = 0;
  local_88 = (ulong *)((long)src + (srcSize - 0x10));
  uVar7 = ms->nextToUpdate;
  uVar21 = (ulong)uVar7;
  uVar14 = ((int)local_88 - (int)(local_80 + uVar21)) + 1;
  uVar11 = 8;
  if (uVar14 < 8) {
    uVar11 = uVar14;
  }
  if (local_88 < local_80 + uVar21) {
    uVar11 = uVar25;
  }
  bVar10 = (byte)local_bc;
  local_a0 = ms;
  local_48 = rep;
  if (uVar7 < uVar11 + uVar7) {
    local_a4 = uVar15;
    if (0x20 < ms->rowHashLog + 8) {
LAB_006c049a:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar2 = ms->hashTable;
    pBVar28 = ms->tagTable;
    uVar22 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    local_98 = (ulong *)0xcf1bbcdcbf9b0000;
    do {
      if (local_b8 == 5) {
        uVar27 = *(long *)(local_80 + uVar21) * -0x30e4432345000000;
LAB_006bf4e2:
        uVar27 = (uVar27 ^ uVar22) >> (0x38U - cVar5 & 0x3f);
      }
      else {
        if (local_b8 == 6) {
          uVar27 = *(long *)(local_80 + uVar21) * -0x30e4432340650000;
          goto LAB_006bf4e2;
        }
        uVar27 = (ulong)((*(int *)(local_80 + uVar21) * -0x61c8864f ^ (uint)uVar22) >>
                        (0x18U - cVar5 & 0x1f));
      }
      uVar25 = ((uint)(uVar27 >> 8) & 0xffffff) << (bVar10 & 0x1f);
      if (((ulong)(pUVar2 + uVar25) & 0x3f) != 0) {
LAB_006c03a2:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar28 + uVar25) & ~(-1L << (bVar10 & 0x3f))) != 0) {
LAB_006c0383:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar21 & 7] = (U32)uVar27;
      uVar21 = uVar21 + 1;
    } while (uVar11 + uVar7 != uVar21);
  }
  iLimit = (ulong *)(srcSize + (long)src);
  if (puVar18 < local_88) {
    local_98 = (ulong *)((long)iLimit + -7);
    local_70 = (ulong *)((long)iLimit + -3);
    local_78 = (ulong *)((long)iLimit + -1);
    local_50 = iLimit + -4;
    local_38 = ~(-1L << (bVar10 & 0x3f));
    uVar25 = local_b8;
    do {
      local_68 = -(ulong)local_b4;
      if (local_b4 == 0) {
        pBVar28 = (BYTE *)0x0;
      }
      else {
        pBVar28 = (BYTE *)0x0;
        if (*(int *)(((long)puVar18 + 1) - (ulong)local_b4) == *(int *)((long)puVar18 + 1)) {
          puVar9 = (ulong *)((long)puVar18 + 5);
          puVar12 = (ulong *)((long)puVar18 + local_68 + 5);
          puVar17 = puVar9;
          if (puVar9 < local_98) {
            uVar22 = *puVar9 ^ *puVar12;
            uVar21 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            pBVar28 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
            if (*puVar12 == *puVar9) {
              puVar17 = (ulong *)((long)puVar18 + 0xd);
              puVar12 = (ulong *)((long)puVar18 + local_68 + 0xd);
              do {
                if (local_98 <= puVar17) goto LAB_006bf688;
                uVar21 = *puVar12;
                uVar22 = *puVar17;
                uVar23 = uVar22 ^ uVar21;
                uVar27 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                pBVar28 = (BYTE *)((long)puVar17 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar9));
                puVar17 = puVar17 + 1;
                puVar12 = puVar12 + 1;
              } while (uVar21 == uVar22);
            }
          }
          else {
LAB_006bf688:
            if ((puVar17 < local_70) && ((int)*puVar12 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar12 = (ulong *)((long)puVar12 + 4);
            }
            if ((puVar17 < local_78) && ((short)*puVar12 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar12 = (ulong *)((long)puVar12 + 2);
            }
            if (puVar17 < iLimit) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar12 == (BYTE)*puVar17));
            }
            pBVar28 = (BYTE *)((long)puVar17 - (long)puVar9);
          }
          pBVar28 = pBVar28 + 4;
        }
      }
      local_c8 = 999999999;
      local_a4 = uVar15;
      if (uVar25 == 6) {
        if (local_bc == 6) {
          pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_6
                                     (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
        }
        else if (local_bc == 5) {
          pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_5
                                     (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
        }
        else {
          pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_4
                                     (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
        }
      }
      else if (uVar25 == 5) {
        if (local_bc == 6) {
          pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_6
                                     (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
        }
        else if (local_bc == 5) {
          pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_5
                                     (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
        }
        else {
          pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_4
                                     (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
        }
      }
      else if (local_bc == 6) {
        pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_6
                                   (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
      }
      else if (local_bc == 5) {
        pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_5
                                   (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
      }
      else {
        pBVar8 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_4
                                   (ms,(BYTE *)puVar18,(BYTE *)iLimit,&local_c8);
      }
      local_b0 = pBVar28;
      if (pBVar28 < pBVar8) {
        local_b0 = pBVar8;
      }
      if (local_b0 < (BYTE *)0x4) {
        uVar21 = (long)puVar18 - (long)src;
        puVar18 = (ulong *)((long)puVar18 + (uVar21 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar21);
        uVar15 = local_a4;
        uVar7 = local_b4;
        uVar25 = local_b8;
      }
      else {
        puVar9 = puVar18;
        uVar21 = local_c8;
        if (pBVar8 <= pBVar28) {
          puVar9 = (ulong *)((long)puVar18 + 1);
          uVar21 = 1;
        }
        if (puVar18 < local_88) {
          do {
            puVar17 = (ulong *)((long)puVar18 + 1);
            if (((uVar21 != 0) && (local_b4 != 0)) &&
               (*(int *)puVar17 == *(int *)((long)puVar17 + local_68))) {
              puVar12 = (ulong *)((long)puVar18 + 5);
              puVar13 = (ulong *)((long)puVar18 + local_68 + 5);
              puVar19 = puVar12;
              if (puVar12 < local_98) {
                uVar27 = *puVar12 ^ *puVar13;
                uVar22 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                pBVar28 = (BYTE *)(uVar22 >> 3 & 0x1fffffff);
                if (*puVar13 == *puVar12) {
                  puVar19 = (ulong *)((long)puVar18 + 0xd);
                  puVar13 = (ulong *)((long)puVar18 + local_68 + 0xd);
                  do {
                    if (local_98 <= puVar19) goto LAB_006bf8e0;
                    uVar22 = *puVar13;
                    uVar27 = *puVar19;
                    uVar26 = uVar27 ^ uVar22;
                    uVar23 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)((long)puVar19 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar12))
                    ;
                    puVar19 = puVar19 + 1;
                    puVar13 = puVar13 + 1;
                  } while (uVar22 == uVar27);
                }
              }
              else {
LAB_006bf8e0:
                if ((puVar19 < local_70) && ((int)*puVar13 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar13 = (ulong *)((long)puVar13 + 4);
                }
                if ((puVar19 < local_78) && ((short)*puVar13 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar13 = (ulong *)((long)puVar13 + 2);
                }
                if (puVar19 < iLimit) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar13 == (BYTE)*puVar19));
                }
                pBVar28 = (BYTE *)((long)puVar19 - (long)puVar12);
              }
              uVar15 = (uint)uVar21;
              if (uVar15 == 0) goto LAB_006c0364;
              ms = local_a0;
              if (pBVar28 < (BYTE *)0xfffffffffffffffc) {
                uVar25 = 0x1f;
                if (uVar15 != 0) {
                  for (; uVar15 >> uVar25 == 0; uVar25 = uVar25 - 1) {
                  }
                }
                if ((int)((uVar25 ^ 0x1f) + (int)local_b0 * 3 + -0x1e) < (int)(pBVar28 + 4) * 3) {
                  uVar21 = 1;
                  puVar9 = puVar17;
                  local_b0 = pBVar28 + 4;
                }
              }
            }
            local_c8 = 999999999;
            if (local_b8 == 6) {
              if (local_bc == 6) {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_6
                                            (ms,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              else if (local_bc == 5) {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_5
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              else {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_4
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
            }
            else if (local_b8 == 5) {
              if (local_bc == 6) {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_6
                                            (ms,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              else if (local_bc == 5) {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_5
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              else {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_4
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
            }
            else if (local_bc == 6) {
              pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_6
                                          (ms,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
            }
            else if (local_bc == 5) {
              pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_5
                                          (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
            }
            else {
              pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_4
                                          (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
            }
            ms = local_a0;
            uVar15 = (uint)local_c8;
            if ((uVar15 == 0) || (uVar25 = (uint)uVar21, uVar25 == 0)) {
LAB_006c0364:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            bVar4 = true;
            if ((BYTE *)0x3 < pBVar28) {
              iVar20 = 0x1f;
              if (uVar15 != 0) {
                for (; uVar15 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                }
              }
              uVar15 = 0x1f;
              if (uVar25 != 0) {
                for (; uVar25 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              if ((int)((uVar15 ^ 0x1f) + (int)local_b0 * 4 + -0x1b) < (int)pBVar28 * 4 - iVar20) {
                bVar4 = false;
                puVar9 = puVar17;
                uVar21 = local_c8;
                local_b0 = pBVar28;
              }
            }
            if (bVar4) {
              if (local_88 <= puVar17) break;
              puVar17 = (ulong *)((long)puVar18 + 2);
              if (((uVar21 != 0) && (local_b4 != 0)) &&
                 (*(int *)puVar17 == *(int *)((long)puVar17 + local_68))) {
                puVar12 = (ulong *)((long)puVar18 + 6);
                puVar13 = (ulong *)((long)puVar18 + local_68 + 6);
                puVar19 = puVar12;
                if (puVar12 < local_98) {
                  uVar27 = *puVar12 ^ *puVar13;
                  uVar22 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  pBVar28 = (BYTE *)(uVar22 >> 3 & 0x1fffffff);
                  if (*puVar13 == *puVar12) {
                    puVar19 = (ulong *)((long)puVar18 + 0xe);
                    puVar13 = (ulong *)((long)puVar18 + local_68 + 0xe);
                    do {
                      if (local_98 <= puVar19) goto LAB_006bfbc8;
                      uVar22 = *puVar13;
                      uVar27 = *puVar19;
                      uVar26 = uVar27 ^ uVar22;
                      uVar23 = 0;
                      if (uVar26 != 0) {
                        for (; (uVar26 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      pBVar28 = (BYTE *)((long)puVar19 +
                                        ((uVar23 >> 3 & 0x1fffffff) - (long)puVar12));
                      puVar19 = puVar19 + 1;
                      puVar13 = puVar13 + 1;
                    } while (uVar22 == uVar27);
                  }
                }
                else {
LAB_006bfbc8:
                  if ((puVar19 < local_70) && ((int)*puVar13 == (int)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 4);
                    puVar13 = (ulong *)((long)puVar13 + 4);
                  }
                  if ((puVar19 < local_78) && ((short)*puVar13 == (short)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 2);
                    puVar13 = (ulong *)((long)puVar13 + 2);
                  }
                  if (puVar19 < iLimit) {
                    puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar13 == (BYTE)*puVar19));
                  }
                  pBVar28 = (BYTE *)((long)puVar19 - (long)puVar12);
                }
                uVar15 = (uint)uVar21;
                if (uVar15 == 0) goto LAB_006c0364;
                if (pBVar28 < (BYTE *)0xfffffffffffffffc) {
                  uVar25 = 0x1f;
                  if (uVar15 != 0) {
                    for (; uVar15 >> uVar25 == 0; uVar25 = uVar25 - 1) {
                    }
                  }
                  if ((int)((uVar25 ^ 0x1f) + (int)local_b0 * 4 + -0x1e) < (int)(pBVar28 + 4) * 4) {
                    uVar21 = 1;
                    puVar9 = puVar17;
                    local_b0 = pBVar28 + 4;
                  }
                }
              }
              local_c8 = 999999999;
              if (local_b8 == 6) {
                if (local_bc == 6) {
                  pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_6
                                              (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
                }
                else if (local_bc == 5) {
                  pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_5
                                              (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
                }
                else {
                  pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_6_4
                                              (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
                }
              }
              else if (local_b8 == 5) {
                if (local_bc == 6) {
                  pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_6
                                              (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
                }
                else if (local_bc == 5) {
                  pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_5
                                              (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
                }
                else {
                  pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_5_4
                                              (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
                }
              }
              else if (local_bc == 6) {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_6
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              else if (local_bc == 5) {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_5
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              else {
                pBVar28 = (BYTE *)ZSTD_RowFindBestMatch_noDict_4_4
                                            (local_a0,(BYTE *)puVar17,(BYTE *)iLimit,&local_c8);
              }
              uVar15 = (uint)local_c8;
              if ((uVar15 == 0) || (uVar25 = (uint)uVar21, uVar25 == 0)) goto LAB_006c0364;
              bVar4 = true;
              if ((BYTE *)0x3 < pBVar28) {
                iVar20 = 0x1f;
                if (uVar15 != 0) {
                  for (; uVar15 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                  }
                }
                uVar15 = 0x1f;
                if (uVar25 != 0) {
                  for (; uVar25 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)local_b0 * 4 + -0x18) < (int)pBVar28 * 4 - iVar20)
                {
                  bVar4 = false;
                  puVar9 = puVar17;
                  uVar21 = local_c8;
                  local_b0 = pBVar28;
                }
              }
              if (bVar4) break;
            }
            puVar18 = puVar17;
          } while (puVar18 < local_88);
        }
        pBVar28 = local_b0;
        uVar15 = local_a4;
        uVar7 = local_b4;
        if (3 < uVar21) {
          if ((src < puVar9) && (local_40 < (BYTE *)((long)puVar9 + (3 - uVar21)))) {
            puVar18 = puVar9;
            while (puVar9 = puVar18,
                  *(BYTE *)((long)puVar18 + -1) == *(BYTE *)((long)puVar18 + (2 - uVar21))) {
              puVar9 = (ulong *)((long)puVar18 + -1);
              pBVar28 = pBVar28 + 1;
              if ((puVar9 <= src) ||
                 (pBVar8 = (BYTE *)((long)puVar18 + (2 - uVar21)), puVar18 = puVar9,
                 pBVar8 <= local_40)) break;
            }
          }
          uVar15 = local_b4;
          uVar7 = (U32)uVar21 - 3;
        }
        uVar22 = (ulong)uVar7;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_006c03ff:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_b0 = pBVar28;
        if (0x20000 < seqStore->maxNbLit) {
LAB_006c041e:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar27 = (long)puVar9 - (long)src;
        puVar18 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar18 + uVar27)) {
LAB_006c03c1:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < puVar9) {
LAB_006c03e0:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar9) {
          ZSTD_safecopyLiterals((BYTE *)puVar18,(BYTE *)src,(BYTE *)puVar9,(BYTE *)local_50);
        }
        else {
          uVar23 = *(ulong *)((long)src + 8);
          *puVar18 = *src;
          puVar18[1] = uVar23;
          if (0x10 < uVar27) {
            pBVar28 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar28 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar23 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar28 + 0x18) = uVar23;
            if (0x20 < (long)uVar27) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x20);
                uVar6 = puVar1[1];
                pBVar8 = pBVar28 + lVar16 + 0x20;
                *(undefined8 *)pBVar8 = *puVar1;
                *(undefined8 *)(pBVar8 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar8 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar8 + 0x18) = uVar6;
                lVar16 = lVar16 + 0x20;
              } while (pBVar8 + 0x20 < pBVar28 + uVar27);
            }
          }
        }
        ms = local_a0;
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar3 = seqStore->sequences;
        psVar3->litLength = (U16)uVar27;
        psVar3->offBase = (U32)uVar21;
        if (local_b0 < (BYTE *)0x3) {
LAB_006c043d:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if ((BYTE *)0xffff < local_b0 + -3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_006c045c:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(local_b0 + -3);
        seqStore->sequences = psVar3 + 1;
        if (local_a0->lazySkipping != 0) {
          uVar25 = local_a0->nextToUpdate;
          uVar21 = (ulong)uVar25;
          uVar11 = ((int)local_88 - (int)(local_80 + uVar21)) + 1;
          if (7 < uVar11) {
            uVar11 = 8;
          }
          if (local_88 < local_80 + uVar21) {
            uVar11 = 0;
          }
          if (uVar25 < uVar11 + uVar25) {
            if (0x20 < local_a0->rowHashLog + 8) goto LAB_006c049a;
            pUVar2 = local_a0->hashTable;
            pBVar28 = local_a0->tagTable;
            uVar27 = local_a0->hashSalt;
            cVar5 = (char)local_a0->rowHashLog;
            do {
              if (local_b8 == 5) {
                uVar23 = *(long *)(local_80 + uVar21) * -0x30e4432345000000;
LAB_006c0053:
                uVar14 = (uint)((uVar23 ^ uVar27) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_b8 == 6) {
                  uVar23 = *(long *)(local_80 + uVar21) * -0x30e4432340650000;
                  goto LAB_006c0053;
                }
                uVar14 = (*(int *)(local_80 + uVar21) * -0x61c8864f ^ (uint)uVar27) >>
                         (0x18U - cVar5 & 0x1f);
              }
              uVar29 = (uVar14 >> 8) << ((byte)local_bc & 0x1f);
              if (((ulong)(pUVar2 + uVar29) & 0x3f) != 0) goto LAB_006c03a2;
              if ((local_38 & (ulong)(pBVar28 + uVar29)) != 0) goto LAB_006c0383;
              local_a0->hashCache[(uint)uVar21 & 7] = uVar14;
              uVar21 = uVar21 + 1;
            } while (uVar11 + uVar25 != uVar21);
          }
          local_a0->lazySkipping = 0;
        }
        puVar18 = (ulong *)((long)puVar9 + (long)local_b0);
        src = puVar18;
        uVar25 = local_b8;
        if ((uVar15 != 0) && (uVar21 = (ulong)uVar15, puVar18 <= local_88)) {
          while( true ) {
            uVar27 = uVar21;
            uVar14 = (uint)uVar27;
            uVar11 = (uint)uVar22;
            src = puVar18;
            uVar15 = uVar14;
            uVar7 = uVar11;
            if ((int)*puVar18 != *(int *)((long)puVar18 - uVar27)) break;
            puVar9 = (ulong *)((long)puVar18 + 4);
            puVar12 = (ulong *)((long)puVar18 + (4 - uVar27));
            puVar17 = puVar9;
            if (puVar9 < local_98) {
              uVar23 = *puVar9 ^ *puVar12;
              uVar21 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              pBVar28 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
              if (*puVar12 == *puVar9) {
                puVar17 = (ulong *)((long)puVar18 + 0xc);
                puVar12 = (ulong *)((long)puVar18 + (0xc - uVar27));
                do {
                  if (local_98 <= puVar17) goto LAB_006c01a1;
                  uVar21 = *puVar12;
                  uVar23 = *puVar17;
                  uVar24 = uVar23 ^ uVar21;
                  uVar26 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pBVar28 = (BYTE *)((long)puVar17 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar9));
                  puVar17 = puVar17 + 1;
                  puVar12 = puVar12 + 1;
                } while (uVar21 == uVar23);
              }
            }
            else {
LAB_006c01a1:
              if ((puVar17 < local_70) && ((int)*puVar12 == (int)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 4);
                puVar12 = (ulong *)((long)puVar12 + 4);
              }
              if ((puVar17 < local_78) && ((short)*puVar12 == (short)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 2);
                puVar12 = (ulong *)((long)puVar12 + 2);
              }
              if (puVar17 < iLimit) {
                puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar12 == (BYTE)*puVar17));
              }
              pBVar28 = (BYTE *)((long)puVar17 - (long)puVar9);
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_006c03ff;
            if (0x20000 < seqStore->maxNbLit) goto LAB_006c041e;
            puVar9 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar9) goto LAB_006c03c1;
            if (iLimit < puVar18) goto LAB_006c03e0;
            if (local_50 < puVar18) {
              ZSTD_safecopyLiterals((BYTE *)puVar9,(BYTE *)puVar18,(BYTE *)puVar18,(BYTE *)local_50)
              ;
              uVar25 = local_b8;
            }
            else {
              uVar21 = puVar18[1];
              *puVar9 = *puVar18;
              puVar9[1] = uVar21;
            }
            psVar3 = seqStore->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (pBVar28 + 4 < (BYTE *)0x3) goto LAB_006c043d;
            if ((BYTE *)0xffff < pBVar28 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006c045c;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(pBVar28 + 1);
            seqStore->sequences = psVar3 + 1;
            puVar18 = (ulong *)((long)puVar18 + (long)(pBVar28 + 4));
            src = puVar18;
            uVar15 = uVar11;
            uVar7 = uVar14;
            if ((uVar11 == 0) || (uVar21 = uVar22, uVar22 = uVar27, local_88 < puVar18)) break;
          }
        }
      }
      local_b4 = uVar7;
    } while (puVar18 < local_88);
  }
  if (local_5c <= local_54) {
    local_5c = 0;
  }
  uVar25 = local_5c;
  if (local_b4 != 0) {
    uVar25 = local_58;
  }
  if (local_58 <= local_54) {
    uVar25 = local_5c;
    local_58 = 0;
  }
  if (local_b4 != 0) {
    local_58 = local_b4;
  }
  if (uVar15 != 0) {
    uVar25 = uVar15;
  }
  *local_48 = local_58;
  local_48[1] = uVar25;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_noDict);
}